

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void dbg_msg(char *sys,char *fmt,...)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  DBG_LOGGER *pp_Var4;
  long in_FS_OFFSET;
  char timestr [80];
  char str [4096];
  va_list args;
  
  str[0x28] = '\0';
  str[0x29] = '\0';
  str[0x2a] = '\0';
  str[0x2b] = '\0';
  str[0x2c] = '\0';
  str[0x2d] = '\0';
  str[0x2e] = '\0';
  str[0x2f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_timestamp_format(timestr,0x50,"%Y-%m-%d %H:%M:%S");
  str_format(str,0x1000,"[%s][%s]: ",timestr,sys);
  sVar2 = strlen(str);
  __vsnprintf_chk(str + (int)sVar2,0x1000 - (long)(int)sVar2,1,0xffffffffffffffff,fmt);
  pp_Var4 = loggers;
  for (lVar3 = 0; lVar3 < num_loggers; lVar3 = lVar3 + 1) {
    (**pp_Var4)(str);
    pp_Var4 = pp_Var4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void dbg_msg(const char *sys, const char *fmt, ...)
{
	va_list args;
	char str[1024*4];
	char *msg;
	int i, len;

	char timestr[80];
	str_timestamp_format(timestr, sizeof(timestr), FORMAT_SPACE);

	str_format(str, sizeof(str), "[%s][%s]: ", timestr, sys);

	len = str_length(str);
	msg = (char *)str + len;

	va_start(args, fmt);
#if defined(CONF_FAMILY_WINDOWS) && !defined(__GNUC__)
	_vsprintf_p(msg, sizeof(str)-len, fmt, args);
#else
	vsnprintf(msg, sizeof(str)-len, fmt, args);
#endif
	va_end(args);

	for(i = 0; i < num_loggers; i++)
		loggers[i](str);
}